

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d_test.cc
# Opt level: O0

ParamGenerator<std::tuple<unsigned_char,_unsigned_char,_double,_double>_>
anon_unknown.dwarf_ec30ed::gtest_CAV1FwdTxfm2d_EvalGenerator_(void)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  ParamGenerator<std::tuple<unsigned_char,_unsigned_char,_double,_double>_> PVar1;
  vector<std::tuple<unsigned_char,_unsigned_char,_double,_double>,_std::allocator<std::tuple<unsigned_char,_unsigned_char,_double,_double>_>_>
  *in_stack_ffffffffffffffd0;
  vector<std::tuple<unsigned_char,_unsigned_char,_double,_double>,_std::allocator<std::tuple<unsigned_char,_unsigned_char,_double,_double>_>_>
  *in_stack_ffffffffffffffd8;
  
  GetTxfm2dParamList();
  testing::
  ValuesIn<std::vector<std::tuple<unsigned_char,unsigned_char,double,double>,std::allocator<std::tuple<unsigned_char,unsigned_char,double,double>>>>
            (in_stack_ffffffffffffffd8);
  std::
  vector<std::tuple<unsigned_char,_unsigned_char,_double,_double>,_std::allocator<std::tuple<unsigned_char,_unsigned_char,_double,_double>_>_>
  ::~vector(in_stack_ffffffffffffffd0);
  PVar1.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<std::tuple<unsigned_char,_unsigned_char,_double,_double>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = extraout_RDX._M_pi;
  PVar1.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<std::tuple<unsigned_char,_unsigned_char,_double,_double>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = in_RDI;
  return (ParamGenerator<std::tuple<unsigned_char,_unsigned_char,_double,_double>_>)
         PVar1.impl_.
         super___shared_ptr<const_testing::internal::ParamGeneratorInterface<std::tuple<unsigned_char,_unsigned_char,_double,_double>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

TEST_P(AV1FwdTxfm2d, RunFwdAccuracyCheck) { RunFwdAccuracyCheck(); }